

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testMultiPartApi.cpp
# Opt level: O2

void anon_unknown.dwarf_1a8469::testWriteRead
               (int partNumber,int runCount,int randomReadCount,string *tempDir)

{
  ulong *__s;
  ulong *__s_00;
  ulong *__s_01;
  pointer pWVar1;
  pointer pWVar2;
  WritingTaskData *__n;
  float fVar3;
  LineOrder LVar4;
  Compression CVar5;
  undefined4 uVar6;
  Array2D<Imf_2_5::FrameBuffer> *pAVar7;
  pointer pWVar8;
  _Alloc_hider _Var9;
  __type _Var10;
  int iVar11;
  int iVar12;
  uint uVar13;
  int iVar14;
  int iVar15;
  uint uVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  ostream *poVar22;
  ulong __new_size;
  ulong *puVar23;
  ulong *puVar24;
  ulong *puVar25;
  ChannelList *pCVar26;
  TileDescription *tileDesc;
  ulong uVar27;
  TiledOutputPart *this;
  OutputPart *this_00;
  ThreadPool *pTVar28;
  _Vector_base<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
  *__dest;
  Task *pTVar29;
  Header *pHVar30;
  Box2i *pBVar31;
  Box2i *pBVar32;
  float *pfVar33;
  V2f *pVVar34;
  V2f *pVVar35;
  LineOrder *pLVar36;
  Compression *pCVar37;
  ConstIterator CVar38;
  Iterator IVar39;
  ChannelList *other;
  string *psVar40;
  string *psVar41;
  long lVar42;
  pointer __p;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  size_t __n_00;
  int i;
  FrameBuffer *pFVar43;
  _Vector_base<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
  *this_01;
  int ty;
  int yLevel;
  ulong uVar44;
  ulong uVar45;
  size_t sVar46;
  pointer ppWVar47;
  int tx;
  ulong uVar48;
  ulong uVar49;
  _Vector_base<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
  *this_02;
  ulong uVar50;
  long lVar51;
  bool bVar52;
  vector<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
  list;
  Array2D<float> floatData;
  TaskGroup taskGroup;
  Array2D<half> halfData;
  MultiPartOutputFile file;
  vector<Imf_2_5::GenericOutputFile_*,_std::allocator<Imf_2_5::GenericOutputFile_*>_> outputfiles;
  Array2D<unsigned_int> uintData;
  vector<Imf_2_5::FrameBuffer,_std::allocator<Imf_2_5::FrameBuffer>_> frameBuffers;
  Array<Imf_2_5::Array2D<Imf_2_5::FrameBuffer>_> tiledFrameBuffers;
  vector<(anonymous_namespace)::WritingTaskData,_std::allocator<(anonymous_namespace)::WritingTaskData>_>
  taskList;
  int *numXTiles;
  size_t local_1f0;
  ulong local_1e8;
  pointer local_1e0;
  string fn;
  vector<void_*,_std::allocator<void_*>_> parts;
  
  poVar22 = std::operator<<((ostream *)&std::cout,"Testing file with ");
  poVar22 = (ostream *)std::ostream::operator<<(poVar22,partNumber);
  poVar22 = std::operator<<(poVar22," part(s).");
  std::endl<char,std::char_traits<char>>(poVar22);
  std::ostream::flush();
  std::operator+(&fn,tempDir,"imf_test_multipart_threading.exr");
  __new_size = (ulong)(uint)partNumber;
  lVar42 = __new_size * 0x18;
  local_1e8 = lVar42 + 8;
  local_1f0 = lVar42 - (lVar42 - 0x18U) % 0x18;
  if (partNumber < 1) {
    partNumber = 0;
  }
  uVar50 = (ulong)(uint)partNumber;
  if (randomReadCount < 1) {
    randomReadCount = 0;
  }
  if (runCount < 1) {
    runCount = 0;
  }
  iVar21 = 0;
  do {
    if (iVar21 == runCount) {
      std::__cxx11::string::~string((string *)&fn);
      return;
    }
    halfData._sizeX = 0;
    halfData._sizeY = 0;
    halfData._data = (half *)0x0;
    floatData._sizeX = 0;
    floatData._sizeY = 0;
    floatData._data = (float *)0x0;
    uintData._sizeX = 0;
    uintData._sizeY = 0;
    uintData._data = (uint *)0x0;
    fillPixels<unsigned_int>(&uintData,0xc5,0x107);
    fillPixels<half>(&halfData,0xc5,0x107);
    fillPixels<float>(&floatData,0xc5,0x107);
    uVar44 = local_1e8;
    puVar23 = (ulong *)operator_new__(local_1e8);
    sVar46 = local_1f0;
    *puVar23 = __new_size;
    __s = puVar23 + 1;
    memset(__s,0,local_1f0);
    puVar24 = (ulong *)operator_new__(uVar44);
    *puVar24 = __new_size;
    __s_00 = puVar24 + 1;
    memset(__s_00,0,sVar46);
    puVar25 = (ulong *)operator_new__(uVar44);
    *puVar25 = __new_size;
    __s_01 = puVar25 + 1;
    memset(__s_01,0,sVar46);
    outputfiles.
    super__Vector_base<Imf_2_5::GenericOutputFile_*,_std::allocator<Imf_2_5::GenericOutputFile_*>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    outputfiles.
    super__Vector_base<Imf_2_5::GenericOutputFile_*,_std::allocator<Imf_2_5::GenericOutputFile_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    outputfiles.
    super__Vector_base<Imf_2_5::GenericOutputFile_*,_std::allocator<Imf_2_5::GenericOutputFile_*>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    taskList.
    super__Vector_base<(anonymous_namespace)::WritingTaskData,_std::allocator<(anonymous_namespace)::WritingTaskData>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    taskList.
    super__Vector_base<(anonymous_namespace)::WritingTaskData,_std::allocator<(anonymous_namespace)::WritingTaskData>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    taskList.
    super__Vector_base<(anonymous_namespace)::WritingTaskData,_std::allocator<(anonymous_namespace)::WritingTaskData>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<int,_std::allocator<int>_>::resize
              ((vector<int,_std::allocator<int>_> *)&(anonymous_namespace)::pixelTypes,__new_size);
    std::vector<int,_std::allocator<int>_>::resize
              ((vector<int,_std::allocator<int>_> *)&(anonymous_namespace)::partTypes,__new_size);
    std::vector<int,_std::allocator<int>_>::resize
              ((vector<int,_std::allocator<int>_> *)&(anonymous_namespace)::levelModes,__new_size);
    std::operator<<((ostream *)&std::cout,"Generating headers and data ");
    std::ostream::flush();
    std::vector<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>::clear
              ((vector<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_> *)
               &(anonymous_namespace)::headers);
    for (uVar44 = 0; uVar44 != uVar50; uVar44 = uVar44 + 1) {
      parts.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      Imf_2_5::Header::Header
                ((Header *)&frameBuffers,0xc5,0x107,1.0,(V2f *)&parts,1.0,INCREASING_Y,
                 ZIP_COMPRESSION);
      iVar11 = random_int(3);
      iVar12 = random_int(2);
      *(int *)((anonymous_namespace)::pixelTypes + uVar44 * 4) = iVar11;
      *(int *)((anonymous_namespace)::partTypes + uVar44 * 4) = iVar12;
      std::__cxx11::stringstream::stringstream((stringstream *)&parts);
      iVar17 = (int)uVar44;
      std::ostream::operator<<
                (&parts.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,iVar17);
      std::__cxx11::stringbuf::str();
      Imf_2_5::Header::setName((Header *)&frameBuffers,(string *)&list);
      std::__cxx11::string::~string((string *)&list);
      if (iVar11 == 0) {
        pCVar26 = Imf_2_5::Header::channels((Header *)&frameBuffers);
        Imf_2_5::Channel::Channel((Channel *)&list,UINT,1,1,false);
        Imf_2_5::ChannelList::insert(pCVar26,"UINT",(Channel *)&list);
      }
      else if (iVar11 == 1) {
        pCVar26 = Imf_2_5::Header::channels((Header *)&frameBuffers);
        Imf_2_5::Channel::Channel((Channel *)&list,FLOAT,1,1,false);
        Imf_2_5::ChannelList::insert(pCVar26,"FLOAT",(Channel *)&list);
      }
      else if (iVar11 == 2) {
        pCVar26 = Imf_2_5::Header::channels((Header *)&frameBuffers);
        Imf_2_5::Channel::Channel((Channel *)&list,HALF,1,1,false);
        Imf_2_5::ChannelList::insert(pCVar26,"HALF",(Channel *)&list);
      }
      if (iVar12 == 1) {
        Imf_2_5::Header::setType((Header *)&frameBuffers,(string *)Imf_2_5::TILEDIMAGE_abi_cxx11_);
        iVar11 = random_int(0xc5);
        iVar12 = random_int(0x107);
        uVar13 = random_int(3);
        *(uint *)((anonymous_namespace)::levelModes + uVar44 * 4) = uVar13;
        uVar16 = 3;
        if (uVar13 < 3) {
          uVar16 = uVar13;
        }
        list.
        super__Vector_base<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)CONCAT44(iVar12 + 1,iVar11 + 1);
        list.
        super__Vector_base<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)(ulong)uVar16;
        Imf_2_5::Header::setTileDescription((Header *)&frameBuffers,(TileDescription *)&list);
        bVar52 = uVar13 != 1;
LAB_001629c0:
        tileDesc = Imf_2_5::Header::tileDescription((Header *)&frameBuffers);
        Imf_2_5::precalculateTileInfo
                  (tileDesc,0,0xc4,0,0x106,&numXTiles,(int **)&file,(int *)&tiledFrameBuffers,
                   (int *)&taskGroup);
        for (lVar42 = 0; lVar42 < (int)tiledFrameBuffers._size; lVar42 = lVar42 + 1) {
          for (lVar51 = 0; lVar51 < _taskGroup; lVar51 = lVar51 + 1) {
            if (!(bool)(~bVar52 & lVar42 != lVar51)) {
              for (iVar11 = 0; iVar11 < numXTiles[lVar42]; iVar11 = iVar11 + 1) {
                for (iVar12 = 0;
                    iVar12 < *(int *)((long)file.super_GenericOutputFile._vptr_GenericOutputFile +
                                     lVar51 * 4); iVar12 = iVar12 + 1) {
                  list.
                  super__Vector_base<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
                  ._M_impl.super__Vector_impl_data._M_start = (pointer)CONCAT44(iVar11,iVar17);
                  list.
                  super__Vector_base<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish = (pointer)CONCAT44((int)lVar42,iVar12)
                  ;
                  list.
                  super__Vector_base<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage =
                       (pointer)CONCAT44(list.
                                         super__Vector_base<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                                         (int)lVar51);
                  std::
                  vector<(anonymous_namespace)::WritingTaskData,_std::allocator<(anonymous_namespace)::WritingTaskData>_>
                  ::push_back(&taskList,(value_type *)&list);
                }
              }
            }
          }
        }
        if (numXTiles != (int *)0x0) {
          operator_delete__(numXTiles);
        }
        if (file.super_GenericOutputFile._vptr_GenericOutputFile != (_func_int **)0x0) {
          operator_delete__(file.super_GenericOutputFile._vptr_GenericOutputFile);
        }
      }
      else {
        bVar52 = true;
        if (iVar12 != 0) goto LAB_001629c0;
        Imf_2_5::Header::setType
                  ((Header *)&frameBuffers,(string *)Imf_2_5::SCANLINEIMAGE_abi_cxx11_);
        iVar11 = 0x107;
        while (bVar52 = iVar11 != 0, iVar11 = iVar11 + -1, bVar52) {
          list.
          super__Vector_base<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
          ._M_impl.super__Vector_impl_data._M_start =
               (pointer)CONCAT44(list.
                                 super__Vector_base<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
                                 ._M_impl.super__Vector_impl_data._M_start._4_4_,iVar17);
          std::
          vector<(anonymous_namespace)::WritingTaskData,_std::allocator<(anonymous_namespace)::WritingTaskData>_>
          ::push_back(&taskList,(value_type *)&list);
        }
      }
      std::vector<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>::push_back
                ((vector<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_> *)
                 &(anonymous_namespace)::headers,(value_type *)&frameBuffers);
      std::__cxx11::stringstream::~stringstream((stringstream *)&parts);
      Imf_2_5::Header::~Header((Header *)&frameBuffers);
    }
    poVar22 = std::operator<<((ostream *)&std::cout,"Shuffling ");
    pWVar8 = taskList.
             super__Vector_base<(anonymous_namespace)::WritingTaskData,_std::allocator<(anonymous_namespace)::WritingTaskData>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar27 = ((long)taskList.
                    super__Vector_base<(anonymous_namespace)::WritingTaskData,_std::allocator<(anonymous_namespace)::WritingTaskData>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
             (long)taskList.
                   super__Vector_base<(anonymous_namespace)::WritingTaskData,_std::allocator<(anonymous_namespace)::WritingTaskData>_>
                   ._M_impl.super__Vector_impl_data._M_start) / 0x14;
    poVar22 = std::ostream::_M_insert<unsigned_long>((ulong)poVar22);
    std::operator<<(poVar22," tasks ");
    std::ostream::flush();
    iVar11 = (int)uVar27;
    uVar48 = 0;
    uVar44 = uVar48;
    if (0 < iVar11) {
      uVar48 = uVar27 & 0xffffffff;
      uVar44 = uVar48;
    }
    while (iVar12 = (int)uVar48, uVar48 = (ulong)(iVar12 - 1), iVar12 != 0) {
      iVar14 = random_int(iVar11);
      iVar15 = random_int(iVar11);
      iVar12 = pWVar8[iVar14].ly;
      parts.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage =
           (pointer)CONCAT44(parts.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage._4_4_,iVar12);
      parts.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
      _M_start = *(pointer *)(pWVar8 + iVar14);
      parts.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
      _M_finish = *(pointer *)&pWVar8[iVar14].ty;
      pWVar8[iVar14].ly = pWVar8[iVar15].ly;
      pWVar1 = pWVar8 + iVar15;
      iVar17 = pWVar1->tx;
      iVar18 = pWVar1->ty;
      iVar19 = pWVar1->lx;
      pWVar2 = pWVar8 + iVar14;
      pWVar2->partNumber = pWVar1->partNumber;
      pWVar2->tx = iVar17;
      pWVar2->ty = iVar18;
      pWVar2->lx = iVar19;
      pWVar8[iVar15].ly = iVar12;
      *(pointer *)(pWVar8 + iVar15) =
           parts.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data
           ._M_start;
      *(pointer *)&pWVar8[iVar15].ty =
           parts.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data
           ._M_finish;
    }
    local_1e0 = pWVar8;
    remove(fn._M_dataplus._M_p);
    _Var9 = fn._M_dataplus;
    lVar42 = DAT_00423cc0;
    pHVar30 = (anonymous_namespace)::headers;
    iVar12 = Imf_2_5::globalThreadCount();
    Imf_2_5::MultiPartOutputFile::MultiPartOutputFile
              (&file,_Var9._M_p,pHVar30,(int)((lVar42 - (long)pHVar30) / 0x38),false,iVar12);
    std::operator<<((ostream *)&std::cout,"Writing tasks ");
    std::ostream::flush();
    parts.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    parts.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    parts.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    std::vector<Imf_2_5::FrameBuffer,_std::allocator<Imf_2_5::FrameBuffer>_>::vector
              (&frameBuffers,__new_size,(allocator_type *)&list);
    Imf_2_5::Array<Imf_2_5::Array2D<Imf_2_5::FrameBuffer>_>::Array(&tiledFrameBuffers,__new_size);
    for (uVar27 = 0; uVar27 != uVar50; uVar27 = uVar27 + 1) {
      if (*(int *)((anonymous_namespace)::partTypes + uVar27 * 4) == 0) {
        this_00 = (OutputPart *)operator_new(8);
        Imf_2_5::OutputPart::OutputPart(this_00,&file,(int)uVar27);
        list.
        super__Vector_base<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)this_00;
        std::vector<void*,std::allocator<void*>>::emplace_back<void*>
                  ((vector<void*,std::allocator<void*>> *)&parts,(void **)&list);
        pFVar43 = frameBuffers.
                  super__Vector_base<Imf_2_5::FrameBuffer,_std::allocator<Imf_2_5::FrameBuffer>_>.
                  _M_impl.super__Vector_impl_data._M_start + uVar27;
        setOutputFrameBuffer
                  (pFVar43,*(int *)((anonymous_namespace)::pixelTypes + uVar27 * 4),&uintData,
                   &floatData,&halfData,0xc5);
        Imf_2_5::OutputPart::setFrameBuffer(this_00,pFVar43);
      }
      else {
        this = (TiledOutputPart *)operator_new(8);
        Imf_2_5::TiledOutputPart::TiledOutputPart(this,&file,(int)uVar27);
        list.
        super__Vector_base<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)this;
        std::vector<void*,std::allocator<void*>>::emplace_back<void*>
                  ((vector<void*,std::allocator<void*>> *)&parts,(void **)&list);
        uVar13 = Imf_2_5::TiledOutputPart::numXLevels(this);
        uVar16 = Imf_2_5::TiledOutputPart::numYLevels(this);
        iVar12 = *(int *)((anonymous_namespace)::pixelTypes + uVar27 * 4);
        if (iVar12 == 0) {
          Imf_2_5::Array2D<Imf_2_5::Array2D<unsigned_int>_>::resizeErase
                    ((Array2D<Imf_2_5::Array2D<unsigned_int>_> *)(__s_01 + uVar27 * 3),
                     (long)(int)uVar16,(long)(int)uVar13);
        }
        else if (iVar12 == 1) {
          Imf_2_5::Array2D<Imf_2_5::Array2D<float>_>::resizeErase
                    ((Array2D<Imf_2_5::Array2D<float>_> *)(__s_00 + uVar27 * 3),(long)(int)uVar16,
                     (long)(int)uVar13);
        }
        else if (iVar12 == 2) {
          Imf_2_5::Array2D<Imf_2_5::Array2D<half>_>::resizeErase
                    ((Array2D<Imf_2_5::Array2D<half>_> *)(__s + uVar27 * 3),(long)(int)uVar16,
                     (long)(int)uVar13);
        }
        Imf_2_5::Array2D<Imf_2_5::FrameBuffer>::resizeErase
                  (tiledFrameBuffers._data + uVar27,(long)(int)uVar16,(long)(int)uVar13);
        if ((int)uVar16 < 1) {
          uVar16 = 0;
        }
        uVar48 = (ulong)uVar13;
        if ((int)uVar13 < 1) {
          uVar48 = 0;
        }
        for (uVar49 = 0; uVar49 != uVar48; uVar49 = uVar49 + 1) {
          for (uVar45 = 0; uVar16 != uVar45; uVar45 = uVar45 + 1) {
            bVar52 = Imf_2_5::TiledOutputPart::isValidLevel(this,(int)uVar49,(int)uVar45);
            if (bVar52) {
              iVar17 = Imf_2_5::TiledOutputPart::levelWidth(this,(int)uVar49);
              iVar18 = Imf_2_5::TiledOutputPart::levelHeight(this,(int)uVar45);
              lVar42 = tiledFrameBuffers._data[uVar27]._sizeY;
              pFVar43 = tiledFrameBuffers._data[uVar27]._data;
              iVar12 = *(int *)((anonymous_namespace)::pixelTypes + uVar27 * 4);
              if (iVar12 == 0) {
                fillPixels<unsigned_int>
                          ((Array2D<unsigned_int> *)
                           (uVar49 * 0x18 +
                           __s_01[uVar27 * 3 + 1] * uVar45 * 0x18 + __s_01[uVar27 * 3 + 2]),iVar17,
                           iVar18);
              }
              else if (iVar12 == 1) {
                fillPixels<float>((Array2D<float> *)
                                  (uVar49 * 0x18 +
                                  __s_00[uVar27 * 3 + 1] * uVar45 * 0x18 + __s_00[uVar27 * 3 + 2]),
                                  iVar17,iVar18);
              }
              else if (iVar12 == 2) {
                fillPixels<half>((Array2D<half> *)
                                 (uVar49 * 0x18 +
                                 __s[uVar27 * 3 + 1] * uVar45 * 0x18 + __s[uVar27 * 3 + 2]),iVar17,
                                 iVar18);
              }
              lVar51 = uVar49 * 0x18;
              setOutputFrameBuffer
                        (pFVar43 + lVar42 * uVar45 + uVar49,
                         *(int *)((anonymous_namespace)::pixelTypes + uVar27 * 4),
                         (Array2D<unsigned_int> *)
                         (__s_01[uVar27 * 3 + 1] * uVar45 * 0x18 + __s_01[uVar27 * 3 + 2] + lVar51),
                         (Array2D<float> *)
                         (__s_00[uVar27 * 3 + 1] * uVar45 * 0x18 + __s_00[uVar27 * 3 + 2] + lVar51),
                         (Array2D<half> *)
                         (__s[uVar27 * 3 + 1] * uVar45 * 0x18 + __s[uVar27 * 3 + 2] + lVar51),iVar17
                        );
            }
          }
        }
      }
    }
    IlmThread_2_5::TaskGroup::TaskGroup(&taskGroup);
    pTVar28 = (ThreadPool *)operator_new(0x10);
    IlmThread_2_5::ThreadPool::ThreadPool(pTVar28,0x20);
    list.
    super__Vector_base<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    list.
    super__Vector_base<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    list.
    super__Vector_base<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    uVar27 = 0;
    iVar12 = 0;
    this_02 = (_Vector_base<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
               *)0x0;
    for (lVar42 = 0; uVar44 * 0x14 != lVar42; lVar42 = lVar42 + 0x14) {
      __n = (WritingTaskData *)((long)&local_1e0->partNumber + lVar42);
      if (list.
          super__Vector_base<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
          ._M_impl.super__Vector_impl_data._M_finish ==
          list.
          super__Vector_base<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        sVar46 = (long)list.
                       super__Vector_base<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)this_02;
        if (sVar46 == 0x7ffffffffffffff8) {
          std::__throw_length_error("vector::_M_realloc_insert");
        }
        __p = (pointer)((long)sVar46 >> 3);
        ppWVar47 = (pointer)0x1;
        if ((_Vector_base<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
             *)list.
               super__Vector_base<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
               ._M_impl.super__Vector_impl_data._M_finish != this_02) {
          ppWVar47 = __p;
        }
        this_01 = (_Vector_base<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
                   *)((long)ppWVar47 + (long)__p);
        if ((_Vector_base<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
             *)0xffffffffffffffe < this_01) {
          this_01 = (_Vector_base<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
                     *)0xfffffffffffffff;
        }
        if (CARRY8((ulong)ppWVar47,(ulong)__p)) {
          this_01 = (_Vector_base<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
                     *)0xfffffffffffffff;
        }
        __dest = (_Vector_base<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
                  *)std::
                    _Vector_base<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
                    ::_M_allocate(this_01,(size_t)__n);
        *(WritingTaskData **)((long)__dest + sVar46) = __n;
        __n_00 = extraout_RDX;
        if (0 < (long)sVar46) {
          memmove(__dest,this_02,sVar46);
          __n_00 = extraout_RDX_00;
        }
        ppWVar47 = (pointer)(sVar46 + (long)__dest);
        std::
        _Vector_base<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
        ::_M_deallocate(this_02,__p,__n_00);
        list.
        super__Vector_base<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)(&(__dest->_M_impl).super__Vector_impl_data._M_start + (long)this_01);
        list.
        super__Vector_base<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)__dest;
      }
      else {
        *list.
         super__Vector_base<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
         ._M_impl.super__Vector_impl_data._M_finish = __n;
        __dest = this_02;
        ppWVar47 = list.
                   super__Vector_base<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
      }
      list.
      super__Vector_base<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
      ._M_impl.super__Vector_impl_data._M_finish = ppWVar47 + 1;
      if (((int)(uVar27 / 10) * 10 + iVar12 == 0) || ((ulong)(iVar11 - 1) * 0x14 == lVar42)) {
        pTVar29 = (Task *)operator_new(0x38);
        std::
        vector<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
        ::vector((vector<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
                  *)&numXTiles,&list);
        pAVar7 = tiledFrameBuffers._data;
        IlmThread_2_5::Task::Task(pTVar29,&taskGroup);
        *(undefined ***)pTVar29 = &PTR__WritingTask_00420228;
        *(MultiPartOutputFile **)(pTVar29 + 0x10) = &file;
        std::
        vector<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
        ::vector((vector<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
                  *)(pTVar29 + 0x18),
                 (vector<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
                  *)&numXTiles);
        *(Array2D<Imf_2_5::FrameBuffer> **)(pTVar29 + 0x30) = pAVar7;
        IlmThread_2_5::ThreadPool::addTask((Task *)pTVar28);
        std::
        vector<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
        ::~vector((vector<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
                   *)&numXTiles);
        list.
        super__Vector_base<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)__dest;
      }
      iVar12 = iVar12 + -1;
      uVar27 = (ulong)((int)uVar27 + 1);
      this_02 = __dest;
    }
    for (uVar44 = 0; uVar50 != uVar44; uVar44 = uVar44 + 1) {
      operator_delete(parts.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar44],8);
    }
    (**(code **)(*(long *)pTVar28 + 8))();
    lVar51 = *puVar23 * 0x18;
    lVar42 = lVar51;
    uVar44 = *puVar23;
    while (uVar44 != 0) {
      Imf_2_5::Array2D<Imf_2_5::Array2D<half>_>::~Array2D
                ((Array2D<Imf_2_5::Array2D<half>_> *)((long)puVar23 + lVar42 + -0x10));
      lVar42 = lVar42 + -0x18;
      uVar44 = lVar42;
    }
    operator_delete__(puVar23,lVar51 + 8);
    lVar51 = *puVar25 * 0x18;
    lVar42 = lVar51;
    uVar44 = *puVar25;
    while (uVar44 != 0) {
      Imf_2_5::Array2D<Imf_2_5::Array2D<unsigned_int>_>::~Array2D
                ((Array2D<Imf_2_5::Array2D<unsigned_int>_> *)((long)puVar25 + lVar42 + -0x10));
      lVar42 = lVar42 + -0x18;
      uVar44 = lVar42;
    }
    operator_delete__(puVar25,lVar51 + 8);
    lVar51 = *puVar24 * 0x18;
    lVar42 = lVar51;
    uVar44 = *puVar24;
    while (uVar44 != 0) {
      Imf_2_5::Array2D<Imf_2_5::Array2D<float>_>::~Array2D
                ((Array2D<Imf_2_5::Array2D<float>_> *)((long)puVar24 + lVar42 + -0x10));
      lVar42 = lVar42 + -0x18;
      uVar44 = lVar42;
    }
    operator_delete__(puVar24,lVar51 + 8);
    std::
    vector<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
    ::~vector(&list);
    IlmThread_2_5::TaskGroup::~TaskGroup(&taskGroup);
    Imf_2_5::Array<Imf_2_5::Array2D<Imf_2_5::FrameBuffer>_>::~Array(&tiledFrameBuffers);
    std::vector<Imf_2_5::FrameBuffer,_std::allocator<Imf_2_5::FrameBuffer>_>::~vector(&frameBuffers)
    ;
    std::_Vector_base<void_*,_std::allocator<void_*>_>::~_Vector_base
              (&parts.super__Vector_base<void_*,_std::allocator<void_*>_>);
    Imf_2_5::MultiPartOutputFile::~MultiPartOutputFile(&file);
    std::
    vector<(anonymous_namespace)::WritingTaskData,_std::allocator<(anonymous_namespace)::WritingTaskData>_>
    ::~vector(&taskList);
    std::_Vector_base<Imf_2_5::GenericOutputFile_*,_std::allocator<Imf_2_5::GenericOutputFile_*>_>::
    ~_Vector_base(&outputfiles.
                   super__Vector_base<Imf_2_5::GenericOutputFile_*,_std::allocator<Imf_2_5::GenericOutputFile_*>_>
                 );
    Imf_2_5::Array2D<unsigned_int>::~Array2D(&uintData);
    Imf_2_5::Array2D<float>::~Array2D(&floatData);
    Imf_2_5::Array2D<half>::~Array2D(&halfData);
    _Var9 = fn._M_dataplus;
    frameBuffers.super__Vector_base<Imf_2_5::FrameBuffer,_std::allocator<Imf_2_5::FrameBuffer>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    frameBuffers.super__Vector_base<Imf_2_5::FrameBuffer,_std::allocator<Imf_2_5::FrameBuffer>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    frameBuffers.super__Vector_base<Imf_2_5::FrameBuffer,_std::allocator<Imf_2_5::FrameBuffer>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    list.
    super__Vector_base<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    list.
    super__Vector_base<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    list.
    super__Vector_base<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    halfData._sizeX = 0;
    halfData._sizeY = 0;
    halfData._data = (half *)0x0;
    iVar11 = Imf_2_5::globalThreadCount();
    Imf_2_5::MultiPartInputFile::MultiPartInputFile
              ((MultiPartInputFile *)&uintData,_Var9._M_p,iVar11,true);
    lVar42 = 0;
    for (uVar44 = 0; iVar11 = Imf_2_5::MultiPartInputFile::parts((MultiPartInputFile *)&uintData),
        uVar44 < (ulong)(long)iVar11; uVar44 = uVar44 + 1) {
      pHVar30 = Imf_2_5::MultiPartInputFile::header((MultiPartInputFile *)&uintData,(int)uVar44);
      pBVar31 = Imf_2_5::Header::displayWindow(pHVar30);
      pBVar32 = Imf_2_5::Header::displayWindow
                          ((Header *)
                           (&((anonymous_namespace)::headers->_map)._M_t._M_impl.field_0x0 + lVar42)
                          );
      bVar52 = Imath_2_5::Box<Imath_2_5::Vec2<int>_>::operator==(pBVar31,pBVar32);
      if (!bVar52) {
        __assert_fail("header.displayWindow() == headers[i].displayWindow()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testMultiPartThreading.cpp"
                      ,0x292,"void (anonymous namespace)::readWholeFiles(const std::string &)");
      }
      pBVar31 = Imf_2_5::Header::dataWindow(pHVar30);
      pBVar32 = Imf_2_5::Header::dataWindow
                          ((Header *)
                           (&((anonymous_namespace)::headers->_map)._M_t._M_impl.field_0x0 + lVar42)
                          );
      bVar52 = Imath_2_5::Box<Imath_2_5::Vec2<int>_>::operator==(pBVar31,pBVar32);
      if (!bVar52) {
        __assert_fail("header.dataWindow() == headers[i].dataWindow()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testMultiPartThreading.cpp"
                      ,0x293,"void (anonymous namespace)::readWholeFiles(const std::string &)");
      }
      pfVar33 = Imf_2_5::Header::pixelAspectRatio(pHVar30);
      fVar3 = *pfVar33;
      pfVar33 = Imf_2_5::Header::pixelAspectRatio
                          ((Header *)
                           (&((anonymous_namespace)::headers->_map)._M_t._M_impl.field_0x0 + lVar42)
                          );
      if ((fVar3 != *pfVar33) || (NAN(fVar3) || NAN(*pfVar33))) {
        __assert_fail("header.pixelAspectRatio() == headers[i].pixelAspectRatio()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testMultiPartThreading.cpp"
                      ,0x294,"void (anonymous namespace)::readWholeFiles(const std::string &)");
      }
      pVVar34 = Imf_2_5::Header::screenWindowCenter(pHVar30);
      pVVar35 = Imf_2_5::Header::screenWindowCenter
                          ((Header *)
                           (&((anonymous_namespace)::headers->_map)._M_t._M_impl.field_0x0 + lVar42)
                          );
      if ((((pVVar34->x != pVVar35->x) || (NAN(pVVar34->x) || NAN(pVVar35->x))) ||
          (pVVar34->y != pVVar35->y)) || (NAN(pVVar34->y) || NAN(pVVar35->y))) {
        __assert_fail("header.screenWindowCenter() == headers[i].screenWindowCenter()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testMultiPartThreading.cpp"
                      ,0x295,"void (anonymous namespace)::readWholeFiles(const std::string &)");
      }
      pfVar33 = Imf_2_5::Header::screenWindowWidth(pHVar30);
      fVar3 = *pfVar33;
      pfVar33 = Imf_2_5::Header::screenWindowWidth
                          ((Header *)
                           (&((anonymous_namespace)::headers->_map)._M_t._M_impl.field_0x0 + lVar42)
                          );
      if ((fVar3 != *pfVar33) || (NAN(fVar3) || NAN(*pfVar33))) {
        __assert_fail("header.screenWindowWidth() == headers[i].screenWindowWidth()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testMultiPartThreading.cpp"
                      ,0x296,"void (anonymous namespace)::readWholeFiles(const std::string &)");
      }
      pLVar36 = Imf_2_5::Header::lineOrder(pHVar30);
      LVar4 = *pLVar36;
      pLVar36 = Imf_2_5::Header::lineOrder
                          ((Header *)
                           (&((anonymous_namespace)::headers->_map)._M_t._M_impl.field_0x0 + lVar42)
                          );
      if (LVar4 != *pLVar36) {
        __assert_fail("header.lineOrder() == headers[i].lineOrder()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testMultiPartThreading.cpp"
                      ,0x297,"void (anonymous namespace)::readWholeFiles(const std::string &)");
      }
      pCVar37 = Imf_2_5::Header::compression(pHVar30);
      CVar5 = *pCVar37;
      pCVar37 = Imf_2_5::Header::compression
                          ((Header *)
                           (&((anonymous_namespace)::headers->_map)._M_t._M_impl.field_0x0 + lVar42)
                          );
      if (CVar5 != *pCVar37) {
        __assert_fail("header.compression() == headers[i].compression()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testMultiPartThreading.cpp"
                      ,0x298,"void (anonymous namespace)::readWholeFiles(const std::string &)");
      }
      pCVar26 = Imf_2_5::Header::channels(pHVar30);
      CVar38 = Imf_2_5::ChannelList::begin(pCVar26);
      pCVar26 = Imf_2_5::Header::channels
                          ((Header *)
                           (&((anonymous_namespace)::headers->_map)._M_t._M_impl.field_0x0 + lVar42)
                          );
      IVar39 = Imf_2_5::ChannelList::begin(pCVar26);
      parts.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
      _M_start = *(pointer *)((long)CVar38._i._M_node + 0x120);
      parts.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
      _M_finish = *(pointer *)((long)CVar38._i._M_node + 0x128);
      floatData._sizeX = *(long *)((long)IVar39._i._M_node + 0x120);
      floatData._sizeY = *(long *)((long)IVar39._i._M_node + 0x128);
      bVar52 = Imf_2_5::Channel::operator==((Channel *)&parts,(Channel *)&floatData);
      if (!bVar52) {
        poVar22 = std::operator<<((ostream *)&std::cout," type ");
        poVar22 = (ostream *)
                  std::ostream::operator<<
                            (poVar22,(int)parts.super__Vector_base<void_*,_std::allocator<void_*>_>.
                                          _M_impl.super__Vector_impl_data._M_start);
        poVar22 = std::operator<<(poVar22,", ");
        poVar22 = (ostream *)std::ostream::operator<<(poVar22,(int)floatData._sizeX);
        poVar22 = std::operator<<(poVar22," xSampling ");
        poVar22 = (ostream *)
                  std::ostream::operator<<
                            (poVar22,parts.super__Vector_base<void_*,_std::allocator<void_*>_>.
                                     _M_impl.super__Vector_impl_data._M_start._4_4_);
        poVar22 = std::operator<<(poVar22,", ");
        poVar22 = (ostream *)std::ostream::operator<<(poVar22,floatData._sizeX._4_4_);
        poVar22 = std::operator<<(poVar22," ySampling ");
        poVar22 = (ostream *)
                  std::ostream::operator<<
                            (poVar22,(int)parts.super__Vector_base<void_*,_std::allocator<void_*>_>.
                                          _M_impl.super__Vector_impl_data._M_finish);
        poVar22 = std::operator<<(poVar22,", ");
        poVar22 = (ostream *)std::ostream::operator<<(poVar22,(int)floatData._sizeY);
        poVar22 = std::operator<<(poVar22," pLinear ");
        poVar22 = std::ostream::_M_insert<bool>(SUB81(poVar22,0));
        poVar22 = std::operator<<(poVar22,", ");
        std::ostream::_M_insert<bool>(SUB81(poVar22,0));
        std::ostream::flush();
      }
      pCVar26 = Imf_2_5::Header::channels(pHVar30);
      other = Imf_2_5::Header::channels
                        ((Header *)
                         (&((anonymous_namespace)::headers->_map)._M_t._M_impl.field_0x0 + lVar42));
      bVar52 = Imf_2_5::ChannelList::operator==(pCVar26,other);
      if (!bVar52) {
        __assert_fail("header.channels() == headers[i].channels()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testMultiPartThreading.cpp"
                      ,0x2a9,"void (anonymous namespace)::readWholeFiles(const std::string &)");
      }
      psVar40 = Imf_2_5::Header::name_abi_cxx11_(pHVar30);
      psVar41 = Imf_2_5::Header::name_abi_cxx11_
                          ((Header *)
                           (&((anonymous_namespace)::headers->_map)._M_t._M_impl.field_0x0 + lVar42)
                          );
      _Var10 = std::operator==(psVar40,psVar41);
      if (!_Var10) {
        __assert_fail("header.name() == headers[i].name()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testMultiPartThreading.cpp"
                      ,0x2aa,"void (anonymous namespace)::readWholeFiles(const std::string &)");
      }
      psVar40 = Imf_2_5::Header::type_abi_cxx11_(pHVar30);
      psVar41 = Imf_2_5::Header::type_abi_cxx11_
                          ((Header *)
                           (&((anonymous_namespace)::headers->_map)._M_t._M_impl.field_0x0 + lVar42)
                          );
      _Var10 = std::operator==(psVar40,psVar41);
      if (!_Var10) {
        __assert_fail("header.type() == headers[i].type()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testMultiPartThreading.cpp"
                      ,0x2ab,"void (anonymous namespace)::readWholeFiles(const std::string &)");
      }
      lVar42 = lVar42 + 0x38;
    }
    std::operator<<((ostream *)&std::cout,"Reading whole files ");
    std::ostream::flush();
    floatData._sizeX = 0;
    floatData._sizeY = 0;
    floatData._data = (float *)0x0;
    uVar44 = (DAT_00423cc0 - (long)(anonymous_namespace)::headers) / 0x38;
    iVar11 = 0;
    while( true ) {
      parts.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)CONCAT44(parts.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl
                                   .super__Vector_impl_data._M_start._4_4_,iVar11);
      iVar12 = (int)uVar44;
      if (iVar12 <= iVar11) break;
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)&floatData,(value_type_conflict3 *)&parts);
      iVar11 = (int)parts.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                    super__Vector_impl_data._M_start + 1;
    }
    uVar48 = 0;
    uVar27 = uVar48;
    if (0 < iVar12) {
      uVar48 = uVar44 & 0xffffffff;
      uVar27 = uVar48;
    }
    while (iVar11 = (int)uVar48, uVar48 = (ulong)(iVar11 - 1), iVar11 != 0) {
      iVar11 = random_int(iVar12);
      iVar17 = random_int(iVar12);
      uVar6 = *(undefined4 *)(floatData._sizeX + (long)iVar11 * 4);
      *(undefined4 *)(floatData._sizeX + (long)iVar11 * 4) =
           *(undefined4 *)(floatData._sizeX + (long)iVar17 * 4);
      *(undefined4 *)(floatData._sizeX + (long)iVar17 * 4) = uVar6;
    }
    for (uVar44 = 0; uVar44 != uVar27; uVar44 = uVar44 + 1) {
      iVar11 = *(int *)(floatData._sizeX + uVar44 * 4);
      lVar42 = (long)iVar11;
      if (*(int *)((anonymous_namespace)::partTypes + lVar42 * 4) == 0) {
        parts.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)((ulong)parts.super__Vector_base<void_*,_std::allocator<void_*>_>.
                                     _M_impl.super__Vector_impl_data._M_finish._4_4_ << 0x20);
        parts.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        setInputFrameBuffer((FrameBuffer *)&parts,
                            *(int *)((anonymous_namespace)::pixelTypes + lVar42 * 4),
                            (Array2D<unsigned_int> *)&frameBuffers,(Array2D<float> *)&list,&halfData
                            ,0xc5,0x107);
        Imf_2_5::InputPart::InputPart
                  ((InputPart *)&outputfiles,(MultiPartInputFile *)&uintData,iVar11);
        Imf_2_5::InputPart::setFrameBuffer((InputPart *)&outputfiles,(FrameBuffer *)&parts);
        Imf_2_5::InputPart::readPixels((InputPart *)&outputfiles,0,0x106);
        iVar11 = *(int *)((anonymous_namespace)::pixelTypes + lVar42 * 4);
        if (iVar11 == 0) {
          bVar52 = checkPixels<unsigned_int>((Array2D<unsigned_int> *)&frameBuffers,0xc5,0x107);
          if (!bVar52) {
            __assert_fail("checkPixels<unsigned int>(uData, width, height)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testMultiPartThreading.cpp"
                          ,0x2d4,"void (anonymous namespace)::readWholeFiles(const std::string &)");
          }
        }
        else if (iVar11 == 1) {
          bVar52 = checkPixels<float>((Array2D<float> *)&list,0xc5,0x107);
          if (!bVar52) {
            __assert_fail("checkPixels<float>(fData, width, height)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testMultiPartThreading.cpp"
                          ,0x2d7,"void (anonymous namespace)::readWholeFiles(const std::string &)");
          }
        }
        else if ((iVar11 == 2) && (bVar52 = checkPixels<half>(&halfData,0xc5,0x107), !bVar52)) {
          __assert_fail("checkPixels<half>(hData, width, height)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testMultiPartThreading.cpp"
                        ,0x2da,"void (anonymous namespace)::readWholeFiles(const std::string &)");
        }
        std::
        _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
        ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
                     *)&parts);
      }
      else {
        parts.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)((ulong)parts.super__Vector_base<void_*,_std::allocator<void_*>_>.
                                     _M_impl.super__Vector_impl_data._M_finish._4_4_ << 0x20);
        parts.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        Imf_2_5::TiledInputPart::TiledInputPart
                  ((TiledInputPart *)&outputfiles,(MultiPartInputFile *)&uintData,iVar11);
        iVar11 = Imf_2_5::TiledInputPart::numXLevels((TiledInputPart *)&outputfiles);
        iVar12 = Imf_2_5::TiledInputPart::numYLevels((TiledInputPart *)&outputfiles);
        if (iVar12 < 1) {
          iVar12 = 0;
        }
        if (iVar11 < 1) {
          iVar11 = 0;
        }
        for (iVar17 = 0; iVar17 != iVar11; iVar17 = iVar17 + 1) {
          for (iVar18 = 0; iVar12 != iVar18; iVar18 = iVar18 + 1) {
            bVar52 = Imf_2_5::TiledInputPart::isValidLevel
                               ((TiledInputPart *)&outputfiles,iVar17,iVar18);
            if (bVar52) {
              iVar14 = Imf_2_5::TiledInputPart::levelWidth((TiledInputPart *)&outputfiles,iVar17);
              iVar15 = Imf_2_5::TiledInputPart::levelHeight((TiledInputPart *)&outputfiles,iVar18);
              setInputFrameBuffer((FrameBuffer *)&parts,
                                  *(int *)((anonymous_namespace)::pixelTypes + lVar42 * 4),
                                  (Array2D<unsigned_int> *)&frameBuffers,(Array2D<float> *)&list,
                                  &halfData,0xc5,0x107);
              Imf_2_5::TiledInputPart::setFrameBuffer
                        ((TiledInputPart *)&outputfiles,(FrameBuffer *)&parts);
              iVar19 = Imf_2_5::TiledInputPart::numXTiles((TiledInputPart *)&outputfiles,iVar17);
              iVar20 = Imf_2_5::TiledInputPart::numYTiles((TiledInputPart *)&outputfiles,iVar18);
              Imf_2_5::TiledInputPart::readTiles
                        ((TiledInputPart *)&outputfiles,0,iVar19 + -1,0,iVar20 + -1,iVar17,iVar18);
              iVar19 = *(int *)((anonymous_namespace)::pixelTypes + lVar42 * 4);
              if (iVar19 == 0) {
                bVar52 = checkPixels<unsigned_int>
                                   ((Array2D<unsigned_int> *)&frameBuffers,iVar14,iVar15);
                if (!bVar52) {
                  __assert_fail("checkPixels<unsigned int>(uData, w, h)",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testMultiPartThreading.cpp"
                                ,0x2f7,
                                "void (anonymous namespace)::readWholeFiles(const std::string &)");
                }
              }
              else if (iVar19 == 1) {
                bVar52 = checkPixels<float>((Array2D<float> *)&list,iVar14,iVar15);
                if (!bVar52) {
                  __assert_fail("checkPixels<float>(fData, w, h)",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testMultiPartThreading.cpp"
                                ,0x2fa,
                                "void (anonymous namespace)::readWholeFiles(const std::string &)");
                }
              }
              else if ((iVar19 == 2) &&
                      (bVar52 = checkPixels<half>(&halfData,iVar14,iVar15), !bVar52)) {
                __assert_fail("checkPixels<half>(hData, w, h)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testMultiPartThreading.cpp"
                              ,0x2fd,
                              "void (anonymous namespace)::readWholeFiles(const std::string &)");
              }
            }
          }
        }
        std::
        _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
        ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
                     *)&parts);
      }
    }
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&floatData);
    Imf_2_5::MultiPartInputFile::~MultiPartInputFile((MultiPartInputFile *)&uintData);
    Imf_2_5::Array2D<half>::~Array2D(&halfData);
    Imf_2_5::Array2D<float>::~Array2D((Array2D<float> *)&list);
    Imf_2_5::Array2D<unsigned_int>::~Array2D((Array2D<unsigned_int> *)&frameBuffers);
    std::operator<<((ostream *)&std::cout,"Reading partial files ");
    std::ostream::flush();
    _Var9 = fn._M_dataplus;
    iVar11 = Imf_2_5::globalThreadCount();
    Imf_2_5::MultiPartInputFile::MultiPartInputFile
              ((MultiPartInputFile *)&parts,_Var9._M_p,iVar11,true);
    IlmThread_2_5::TaskGroup::TaskGroup((TaskGroup *)&frameBuffers);
    pTVar28 = (ThreadPool *)operator_new(0x10);
    IlmThread_2_5::ThreadPool::ThreadPool(pTVar28,0x20);
    iVar11 = randomReadCount;
    while (bVar52 = iVar11 != 0, iVar11 = iVar11 + -1, bVar52) {
      pTVar29 = (Task *)operator_new(0x18);
      IlmThread_2_5::Task::Task(pTVar29,(TaskGroup *)&frameBuffers);
      *(undefined ***)pTVar29 = &PTR__Task_00420268;
      *(vector<void_*,_std::allocator<void_*>_> **)(pTVar29 + 0x10) = &parts;
      IlmThread_2_5::ThreadPool::addTask((Task *)pTVar28);
    }
    (**(code **)(*(long *)pTVar28 + 8))(pTVar28);
    IlmThread_2_5::TaskGroup::~TaskGroup((TaskGroup *)&frameBuffers);
    Imf_2_5::MultiPartInputFile::~MultiPartInputFile((MultiPartInputFile *)&parts);
    remove(fn._M_dataplus._M_p);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    std::ostream::flush();
    iVar21 = iVar21 + 1;
  } while( true );
}

Assistant:

void
testWriteRead (int partNumber,
               int runCount,
               int randomReadCount,
               const std::string & tempDir)
{
    cout << "Testing file with " << partNumber << " part(s)." << endl << flush;

    std::string fn = tempDir +  "imf_test_multipart_api.exr";

    for (int i = 0; i < runCount; i++)
    {
        generateRandomFile (partNumber, fn);
        readWholeFiles (fn);
        readPartialFiles (randomReadCount, fn);

        remove (fn.c_str());

        cout << endl << flush;
    }
}